

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_775ed::FileSystemRootNode::get_directory_entries
          (FileSystemRootNode *this,string *path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  pointer pcVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  ostream *poVar5;
  string current;
  string dirname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  local_58 = result;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + path->_M_string_length);
  if (local_78._M_dataplus._M_p[local_78._M_string_length - 1] != '/') {
    std::__cxx11::string::append((char *)&local_78);
  }
  __dirp = opendir(local_78._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"OS","");
    poVar5 = GEO::Logger::err(&local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Could not open directory ",0x19);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  else {
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        sVar4 = strlen(pdVar3->d_name);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,pdVar3->d_name,pdVar3->d_name + sVar4);
        iVar2 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_98);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_78);
            if (iVar2 != 0) {
              std::operator+(&local_50,&local_78,&local_98);
              std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
            }
            iVar2 = (*(this->super_Node).super_Counted._vptr_Counted[2])(this,&local_98);
            if ((char)iVar2 == '\0') {
              iVar2 = (*(this->super_Node).super_Counted._vptr_Counted[3])(this,&local_98);
              if ((char)iVar2 == '\0') goto LAB_0015fc5e;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_58,&local_98);
          }
        }
LAB_0015fc5e:
        pdVar3 = readdir(__dirp);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      } while (pdVar3 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return __dirp != (DIR *)0x0;
}

Assistant:

bool get_directory_entries(
            const std::string& path, std::vector<std::string>& result
        ) override {
            std::string dirname = path;
            if(dirname[dirname.length() - 1] != '/') {
                dirname += "/";
            }
            DIR* dir = opendir(dirname.c_str());
            if(dir == nullptr) {
                Logger::err("OS")
                    << "Could not open directory " << dirname
                    << std::endl;
#ifdef GEO_OS_ANDROID
		static bool first_time = true;
		if(first_time) {
		    Logger::err("OS")
			<< "You may need to grant the \"Storage\" permission"
			<< std::endl
			<< "to this application"
			<< std::endl;
		    Logger::err("OS")
			<< "(see Parameters/Applications"
			<< std::endl
			<< "in Android perferences)"
			<< std::endl;
		    first_time = false;
		}
#endif		
                return false;
            }
            struct dirent* entry = readdir(dir);
            while(entry != nullptr) {
                std::string current = std::string(entry->d_name);
                // Ignore . and ..
                if(current != "." && current != "..") {
                    if(dirname != "./") {
                        current = dirname + current;
                    }
                    // Ignore symbolic links and other special Unix stuff
                    if(is_file(current) || is_directory(current)) {
                        result.push_back(current);
                    }
                }
                entry = readdir(dir);
            }
            closedir(dir);
            return true;
        }